

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilerbug_tests.cpp
# Opt level: O2

void __thiscall compilerbug_tests::gccbug_90348::test_method(gccbug_90348 *this)

{
  long lVar1;
  int j;
  int iVar2;
  long lVar3;
  iterator in_R8;
  iterator in_R9;
  long lVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar5;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  lazy_ostream local_98;
  undefined1 *local_88;
  char **local_80;
  assertion_result local_78;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  uchar in [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      in[lVar3] = '\0';
    }
    local_50 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/compilerbug_tests.cpp"
    ;
    local_48 = "";
    local_60 = &boost::unit_test::basic_cstring<char_const>::null;
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x25;
    file.m_begin = (iterator)&local_50;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_60,msg);
    iVar2 = check_zero(in,(uint)lVar4);
    local_78.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         SUB41(iVar2,0);
    local_78.m_message.px = (element_type *)0x0;
    local_78.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_a8 = "check_zero(in, i)";
    local_a0 = "";
    local_98.m_empty = false;
    local_98._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0113a070;
    local_88 = boost::unit_test::lazy_ostream::inst;
    local_80 = &local_a8;
    local_b8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/compilerbug_tests.cpp"
    ;
    local_b0 = "";
    in_R8 = &DAT_00000001;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_78,&local_98,1,0,WARN,_cVar5,(size_t)&local_b8,0x25);
    boost::detail::shared_count::~shared_count(&local_78.m_message.pn);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(gccbug_90348) {
    // Test for GCC bug 90348. See https://gcc.gnu.org/bugzilla/show_bug.cgi?id=90348
    for (int i = 0; i <= 4; ++i) {
        unsigned char in[4];
        for (int j = 0; j < i; ++j) {
            in[j] = 0;
            set_one_on_stack(); // Apparently modifies in[0]
        }
        BOOST_CHECK(check_zero(in, i));
    }
}